

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratorInfoBase.hpp
# Opt level: O2

void __thiscall
GeneratorInfoBase::GeneratorInfoBase
          (GeneratorInfoBase *this,QAM *finalam,int deriv,OptionMap *options)

{
  this->_vptr_GeneratorInfoBase = (_func_int **)&PTR__GeneratorInfoBase_0014fb78;
  QAM::QAM(&this->finalam_,finalam);
  this->deriv_ = deriv;
  std::
  _Rb_tree<Option,_std::pair<const_Option,_int>,_std::_Select1st<std::pair<const_Option,_int>_>,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
  ::_Rb_tree(&(this->options_)._M_t,&options->_M_t);
  return;
}

Assistant:

GeneratorInfoBase(QAM finalam, int deriv, const OptionMap & options)
        : finalam_(finalam), deriv_(deriv), options_(options) { }